

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.h
# Opt level: O0

unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
 __thiscall
cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraKateGenerator>::
CreateExternalMakefileProjectGenerator
          (cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraKateGenerator> *this)

{
  cmExtraKateGenerator *this_00;
  pointer this_01;
  cmExternalMakefileProjectGeneratorFactory *in_RSI;
  string local_50;
  undefined1 local_19;
  cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraKateGenerator> *this_local;
  unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
  *p;
  
  local_19 = 0;
  this_local = this;
  this_00 = (cmExtraKateGenerator *)operator_new(0x70);
  cmExtraKateGenerator::cmExtraKateGenerator(this_00);
  std::
  unique_ptr<cmExternalMakefileProjectGenerator,std::default_delete<cmExternalMakefileProjectGenerator>>
  ::unique_ptr<std::default_delete<cmExternalMakefileProjectGenerator>,void>
            ((unique_ptr<cmExternalMakefileProjectGenerator,std::default_delete<cmExternalMakefileProjectGenerator>>
              *)this,(pointer)this_00);
  this_01 = std::
            unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
            ::operator->((unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
                          *)this);
  cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_50,in_RSI);
  cmExternalMakefileProjectGenerator::SetName(this_01,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return (__uniq_ptr_data<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>,_true,_true>
          )(__uniq_ptr_data<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmExternalMakefileProjectGenerator>
  CreateExternalMakefileProjectGenerator() const override
  {
    std::unique_ptr<cmExternalMakefileProjectGenerator> p(new T);
    p->SetName(this->GetName());
    return p;
  }